

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re2.cc
# Opt level: O0

void __thiscall
re2::RE2::NamedCapturingGroups::anon_class_8_1_8991fb9c::operator()(anon_class_8_1_8991fb9c *this)

{
  RE2 *pRVar1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  *pmVar2;
  anon_class_8_1_8991fb9c *this_local;
  
  pRVar1 = this->this;
  if (pRVar1->suffix_regexp_ != (Regexp *)0x0) {
    pmVar2 = Regexp::NamedCaptures_abi_cxx11_(pRVar1->suffix_regexp_);
    pRVar1->named_groups_ = pmVar2;
  }
  if (pRVar1->named_groups_ ==
      (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
       *)0x0) {
    pRVar1->named_groups_ = empty_named_groups_abi_cxx11_;
  }
  return;
}

Assistant:

const map<string, int>& RE2::NamedCapturingGroups() const {
  std::call_once(named_groups_once_, [this]() {
    if (suffix_regexp_ != NULL)
      named_groups_ = suffix_regexp_->NamedCaptures();
    if (named_groups_ == NULL)
      named_groups_ = empty_named_groups;
  });
  return *named_groups_;
}